

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O0

SelectionSet * __thiscall
OpenMD::SelectionEvaluator::expression
          (SelectionEvaluator *this,vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *code,
          int pcStart)

{
  SelectionEvaluator *this_00;
  SelectionEvaluator *pSVar1;
  size_type sVar2;
  reference pvVar3;
  uint in_ECX;
  pointer in_RDX;
  SelectionEvaluator *in_RSI;
  Token *in_RDI;
  Token instruction;
  uint pc;
  vector<int,_std::allocator<int>_> bsSize;
  stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
  stack;
  SelectionSet bs;
  string *in_stack_fffffffffffffd78;
  SelectionEvaluator *in_stack_fffffffffffffd80;
  SelectionEvaluator *in_stack_fffffffffffffd88;
  reference in_stack_fffffffffffffd90;
  allocator<char> *in_stack_fffffffffffffdb0;
  SelectionEvaluator *in_stack_fffffffffffffdb8;
  SelectionEvaluator *in_stack_fffffffffffffdc0;
  Token *instruction_00;
  undefined1 local_1f1;
  string *in_stack_fffffffffffffe10;
  SelectionEvaluator *in_stack_fffffffffffffe18;
  Token *in_stack_fffffffffffffe30;
  SelectionEvaluator *in_stack_fffffffffffffe38;
  string local_168 [96];
  SelectionEvaluator *in_stack_fffffffffffffef8;
  undefined4 local_d0;
  uint local_b4;
  uint local_1c;
  undefined8 local_18;
  
  instruction_00 = in_RDI;
  local_1c = in_ECX;
  local_18 = in_RDX;
  createSelectionSets(in_stack_fffffffffffffdb8);
  std::
  stack<OpenMD::SelectionSet,std::deque<OpenMD::SelectionSet,std::allocator<OpenMD::SelectionSet>>>
  ::stack<std::deque<OpenMD::SelectionSet,std::allocator<OpenMD::SelectionSet>>,void>
            ((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
              *)in_stack_fffffffffffffd80);
  SelectionSet::size((SelectionSet *)in_stack_fffffffffffffdb8);
  local_b4 = local_1c;
  while( true ) {
    this_00 = (SelectionEvaluator *)(ulong)local_b4;
    pSVar1 = (SelectionEvaluator *)
             std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::size
                       ((vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)local_18);
    if (pSVar1 <= this_00) break;
    std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::operator[]
              ((vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)local_18,(ulong)local_b4);
    Token::Token((Token *)in_stack_fffffffffffffd80,(Token *)in_stack_fffffffffffffd78);
    if (local_d0 == 1) {
      std::any_cast<std::__cxx11::string>((any *)in_stack_fffffffffffffd88);
      lookupValue(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      std::
      stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
      ::push((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
              *)in_stack_fffffffffffffd80,(value_type *)in_stack_fffffffffffffd78);
      SelectionSet::~SelectionSet((SelectionSet *)0x3c1805);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe48);
    }
    else if (local_d0 == 0x403) {
      std::
      stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
      ::top((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
             *)0x3c1503);
      SelectionSet::operator=
                ((SelectionSet *)in_stack_fffffffffffffd80,(SelectionSet *)in_stack_fffffffffffffd78
                );
      std::
      stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
      ::pop((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
             *)0x3c152b);
      std::
      stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
      ::top((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
             *)0x3c153a);
      SelectionSet::operator&=
                ((SelectionSet *)in_stack_fffffffffffffd80,(SelectionSet *)in_stack_fffffffffffffd78
                );
    }
    else if (local_d0 == 0x404) {
      in_stack_fffffffffffffdb8 =
           (SelectionEvaluator *)
           std::
           stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
           ::top((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
                  *)0x3c149f);
      SelectionSet::operator=
                ((SelectionSet *)in_stack_fffffffffffffd80,(SelectionSet *)in_stack_fffffffffffffd78
                );
      std::
      stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
      ::pop((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
             *)0x3c14c7);
      in_stack_fffffffffffffdb0 =
           (allocator<char> *)
           std::
           stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
           ::top((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
                  *)0x3c14d6);
      SelectionSet::operator|=
                ((SelectionSet *)in_stack_fffffffffffffd80,(SelectionSet *)in_stack_fffffffffffffd78
                );
    }
    else if (local_d0 == 0x405) {
      std::
      stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
      ::top((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
             *)0x3c1567);
      SelectionSet::flip((SelectionSet *)in_stack_fffffffffffffd80);
    }
    else if (local_d0 == 0x409) {
      allInstruction(in_stack_fffffffffffffef8);
      SelectionSet::operator=
                ((SelectionSet *)in_stack_fffffffffffffd80,(SelectionSet *)in_stack_fffffffffffffd78
                );
      SelectionSet::~SelectionSet((SelectionSet *)0x3c1407);
      std::
      stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
      ::push((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
              *)in_stack_fffffffffffffd80,(value_type *)in_stack_fffffffffffffd78);
    }
    else if (local_d0 == 0x40a) {
      createSelectionSets(in_stack_fffffffffffffdb8);
      in_stack_fffffffffffffdc0 = (SelectionEvaluator *)&stack0xffffffffffffff00;
      SelectionSet::operator=
                ((SelectionSet *)in_stack_fffffffffffffd80,(SelectionSet *)in_stack_fffffffffffffd78
                );
      SelectionSet::~SelectionSet((SelectionSet *)0x3c1479);
      std::
      stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
      ::push((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
              *)in_stack_fffffffffffffd80,(value_type *)in_stack_fffffffffffffd78);
    }
    else if (local_d0 == 0x40b) {
      std::any_cast<std::__cxx11::string>((any *)in_stack_fffffffffffffd88);
      nameInstruction(in_stack_fffffffffffffd88,(string *)in_stack_fffffffffffffd80);
      std::
      stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
      ::push((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
              *)in_stack_fffffffffffffd80,(value_type *)in_stack_fffffffffffffd78);
      SelectionSet::~SelectionSet((SelectionSet *)0x3c16e2);
      std::__cxx11::string::~string(local_168);
    }
    else if ((local_d0 != 0x464) && (local_d0 != 0x465)) {
      if (local_d0 == 0x1406) {
        in_stack_fffffffffffffd90 =
             std::
             stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
             ::top((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
                    *)0x3c158c);
        withinInstruction(in_RSI,instruction_00,(SelectionSet *)in_RDI);
      }
      else if (local_d0 == 0x140c) {
        hull(this_00);
        std::
        stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
        ::push((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
                *)in_stack_fffffffffffffd80,(value_type *)in_stack_fffffffffffffd78);
        SelectionSet::~SelectionSet((SelectionSet *)0x3c165d);
      }
      else if (local_d0 == 0x140d) {
        alphaHullInstruction(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
        std::
        stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
        ::push((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
                *)in_stack_fffffffffffffd80,(value_type *)in_stack_fffffffffffffd78);
        SelectionSet::~SelectionSet((SelectionSet *)0x3c15f7);
      }
      else if (local_d0 - 0x3400 < 6) {
        comparatorInstruction(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
        std::
        stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
        ::push((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
                *)in_stack_fffffffffffffd80,(value_type *)in_stack_fffffffffffffd78);
        SelectionSet::~SelectionSet((SelectionSet *)0x3c18a3);
      }
      else if (local_d0 == 0x10400) {
        indexInstruction(in_stack_fffffffffffffe38,(any *)in_stack_fffffffffffffe30);
        std::
        stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
        ::push((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
                *)in_stack_fffffffffffffd80,(value_type *)in_stack_fffffffffffffd78);
        SelectionSet::~SelectionSet((SelectionSet *)0x3c1780);
      }
      else {
        unrecognizedExpression(in_stack_fffffffffffffdc0);
      }
    }
    Token::~Token((Token *)0x3c18e6);
    local_b4 = local_b4 + 1;
  }
  sVar2 = std::
          stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
          ::size((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
                  *)0x3c191b);
  if (sVar2 != 1) {
    in_stack_fffffffffffffd80 = (SelectionEvaluator *)&local_1f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0
              );
    evalError(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe10);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  }
  pvVar3 = std::
           stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
           ::top((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
                  *)0x3c19e4);
  SelectionSet::SelectionSet((SelectionSet *)in_stack_fffffffffffffd80,pvVar3);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd90);
  std::
  stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
  ::~stack((stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
            *)0x3c1a14);
  SelectionSet::~SelectionSet((SelectionSet *)0x3c1a21);
  return (SelectionSet *)instruction_00;
}

Assistant:

SelectionSet SelectionEvaluator::expression(const std::vector<Token>& code,
                                              int pcStart) {
    SelectionSet bs = createSelectionSets();
    std::stack<SelectionSet> stack;
    vector<int> bsSize = bs.size();

    for (unsigned int pc = pcStart; pc < code.size(); ++pc) {
      Token instruction = code[pc];

      switch (instruction.tok) {
      case Token::expressionBegin:
        break;
      case Token::expressionEnd:
        break;
      case Token::all:
        bs = allInstruction();
        stack.push(bs);
        break;
      case Token::none:
        bs = createSelectionSets();
        stack.push(bs);
        break;
      case Token::opOr:
        bs = stack.top();
        stack.pop();
        stack.top() |= bs;
        break;
      case Token::opAnd:
        bs = stack.top();
        stack.pop();
        stack.top() &= bs;
        break;
      case Token::opNot:
        stack.top().flip();
        break;
      case Token::within:
        withinInstruction(instruction, stack.top());
        break;
      case Token::alphahull:
        stack.push(alphaHullInstruction(instruction));
        break;
      case Token::hull:
        stack.push(hull());
        break;
        // case Token::selected:
        //  stack.push(getSelectionSet());
        //  break;
      case Token::name:
        stack.push(
            nameInstruction(std::any_cast<std::string>(instruction.value)));
        break;
      case Token::index:
        stack.push(indexInstruction(instruction.value));
        break;
      case Token::identifier:
        stack.push(lookupValue(std::any_cast<std::string>(instruction.value)));
        break;
      case Token::opLT:
      case Token::opLE:
      case Token::opGE:
      case Token::opGT:
      case Token::opEQ:
      case Token::opNE:
        stack.push(comparatorInstruction(instruction));
        break;
      default:
        unrecognizedExpression();
      }
    }
    if (stack.size() != 1)
      evalError("atom expression compiler error - stack over/underflow");

    return stack.top();
  }